

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.h
# Opt level: O0

Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
* __thiscall
duckdb_skiplistlib::skip_list::
Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
::_Pool::Allocate(_Pool *this,pair<unsigned_long,_duckdb::interval_t> *value)

{
  undefined8 in_RSI;
  long in_RDI;
  Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
  *result;
  pair<unsigned_long,_duckdb::interval_t> *in_stack_ffffffffffffffc8;
  Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
  *in_stack_ffffffffffffffd0;
  undefined8 local_8;
  
  if (*(long *)(in_RDI + 8) == 0) {
    local_8 = (Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
               *)operator_new(0x48);
    Node(local_8,in_RSI,in_RDI);
  }
  else {
    local_8 = *(Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
                **)(in_RDI + 8);
    *(undefined8 *)(in_RDI + 8) = 0;
    Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
    ::Initialize(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  return local_8;
}

Assistant:

Node *Allocate(const T &value) {
			if (cache) {
				Node *result = cache;
				cache = nullptr;
				result->Initialize(value);
				return result;
			}

			return new Node(value, _compare, *this);
		}